

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeTBLInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  DecodeStatus DVar6;
  uint uVar7;
  MCInst *in_RCX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint Rd;
  uint op;
  uint Rm;
  uint Rn;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffffc0;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0xc,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0x16,1);
  uVar4 = uVar3 << 4 | uVar2;
  fieldFromInstruction_4(in_ESI,0x10,4);
  fieldFromInstruction_4(in_ESI,7,1);
  uVar2 = fieldFromInstruction_4(in_ESI,0,4);
  uVar3 = fieldFromInstruction_4(in_ESI,5,1);
  uVar5 = uVar3 << 4 | uVar2;
  uVar2 = fieldFromInstruction_4(in_ESI,6,1);
  DVar6 = DecodeDPRRegisterClass
                    (in_RCX,local_4,CONCAT44(uVar5,uVar2),
                     (void *)CONCAT44(uVar4,in_stack_ffffffffffffffc0));
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
  if (_Var1) {
    if (uVar2 != 0) {
      DVar6 = DecodeDPRRegisterClass
                        (in_RCX,local_4,CONCAT44(uVar5,uVar2),
                         (void *)CONCAT44(uVar4,in_stack_ffffffffffffffc0));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    uVar7 = MCInst_getOpcode(in_RDI);
    if ((uVar7 == 0x8aa) || (uVar7 == 0x8b0)) {
      DVar6 = DecodeDPairRegisterClass
                        (in_RCX,local_4,CONCAT44(uVar5,uVar2),(void *)CONCAT44(uVar4,uVar7));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    else {
      DVar6 = DecodeDPRRegisterClass
                        (in_RCX,local_4,CONCAT44(uVar5,uVar2),(void *)CONCAT44(uVar4,uVar7));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    DVar6 = DecodeDPRRegisterClass
                      (in_RCX,local_4,CONCAT44(uVar5,uVar2),(void *)CONCAT44(uVar4,uVar7));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
    if (!_Var1) {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeTBLInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, op;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rn |= fieldFromInstruction_4(Insn, 7, 1) << 4;
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	Rm |= fieldFromInstruction_4(Insn, 5, 1) << 4;
	op = fieldFromInstruction_4(Insn, 6, 1);

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (op) {
		if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail; // Writeback
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_VTBL2:
		case ARM_VTBX2:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rn, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rn, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}